

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

ssize_t __thiscall input_mod::read(input_mod *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *extraout_RAX;
  void *extraout_RAX_00;
  undefined4 in_register_00000034;
  float fVar4;
  int local_40;
  int i;
  int written;
  input_mod *state;
  void *userdata_local;
  void *pvStack_20;
  int sizebytes_local;
  void *buffer_local;
  SoundStream *stream_local;
  
  pvStack_20 = (void *)CONCAT44(in_register_00000034,__fd);
  userdata_local._4_4_ = (int)__buf;
  if ((*(byte *)(__nbytes + 0x60) & 1) == 0) {
    FCriticalSection::Enter((FCriticalSection *)(__nbytes + 0x80));
    for (; 0 < userdata_local._4_4_; userdata_local._4_4_ = userdata_local._4_4_ + iVar2 * -8) {
      iVar2 = decode_run((input_mod *)__nbytes,pvStack_20,userdata_local._4_4_ / 8);
      if (iVar2 < 0) {
        FCriticalSection::Leave((FCriticalSection *)(__nbytes + 0x80));
        stream_local._7_1_ = 0;
        pvVar3 = extraout_RAX;
        goto LAB_004116c3;
      }
      if (iVar2 == 0) {
        FCriticalSection::Leave((FCriticalSection *)(__nbytes + 0x80));
        pvVar3 = memset(pvStack_20,0,(long)userdata_local._4_4_);
        stream_local._7_1_ = 1;
        goto LAB_004116c3;
      }
      for (local_40 = 0; SBORROW4(local_40,iVar2 * 2) != local_40 + iVar2 * -2 < 0;
          local_40 = local_40 + 1) {
        iVar1 = *(int *)((long)pvStack_20 + (long)local_40 * 4);
        fVar4 = FFloatCVar::operator_cast_to_float(&mod_dumb_mastervolume);
        *(float *)((long)pvStack_20 + (long)local_40 * 4) = ((float)iVar1 / 16777216.0) * fVar4;
      }
      pvStack_20 = (void *)((long)pvStack_20 + (long)(iVar2 << 3));
    }
    FCriticalSection::Leave((FCriticalSection *)(__nbytes + 0x80));
    stream_local._7_1_ = 1;
    pvVar3 = extraout_RAX_00;
  }
  else {
    pvVar3 = memset(pvStack_20,0,(long)userdata_local._4_4_);
    stream_local._7_1_ = 0;
  }
LAB_004116c3:
  return CONCAT71((int7)((ulong)pvVar3 >> 8),stream_local._7_1_);
}

Assistant:

bool input_mod::read(SoundStream *stream, void *buffer, int sizebytes, void *userdata)
{
	input_mod *state = (input_mod *)userdata;
	if (state->eof)
	{
		memset(buffer, 0, sizebytes);
		return false;
	}
	state->crit_sec.Enter();
	while (sizebytes > 0)
	{
		int written = state->decode_run(buffer, sizebytes / 8);
		if (written < 0)
		{
			state->crit_sec.Leave();
			return false;
		}
		if (written == 0)
		{
			state->crit_sec.Leave();
			memset(buffer, 0, sizebytes);
			return true;
		}
		else
		{
			// Convert to float
			for (int i = 0; i < written * 2; ++i)
			{
				((float *)buffer)[i] = (((int *)buffer)[i] / (float)(1 << 24)) * mod_dumb_mastervolume;
			}
		}
		buffer = (BYTE *)buffer + written * 8;
		sizebytes -= written * 8;
	}
	state->crit_sec.Leave();
	return true;
}